

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3cgen.cpp
# Opt level: O3

void __thiscall WasmCGen::Prefix(WasmCGen *this)

{
  puts(
      "#if _MSC_VER\ntypedef signed __int8     int8_t;\ntypedef signed __int16    int16_t;\ntypedef signed __int32    int32_t;\ntypedef signed __int64    int64_t;\ntypedef unsigned __int8  uint8_t;\ntypedef unsigned __int16 uint16_t;\ntypedef unsigned __int32 uint32_t;\ntypedef unsigned __int64 uint64_t;\n#include <stddef.h>\ntypedef size_t uintptr_t;\ntypedef ptrdiff intptr_t;\ntypedef ptrdiff ssize_t;\n#else\n#include <stdint.h>\n#endif\n\nuint32_t PopulationCount64 (uint64_t a);\nuint32_t PopulationCount32 (uint32_t a);\nuint32_t CountTrailingZeros64 (uint64_t a);\nuint32_t CountTrailingZeros32 (uint32_t a);\nuint32_t CountLeadingZeros64 (uint64_t a);\nuint32_t CountLeadingZeros32 (uint32_t a);\nvoid Overflow(void);\n#include <limits.h>"
      );
  return;
}

Assistant:

void WasmCGen::Prefix ()
{
    printf(
"#if _MSC_VER\n"
"typedef signed __int8     int8_t;\n"
"typedef signed __int16    int16_t;\n"
"typedef signed __int32    int32_t;\n"
"typedef signed __int64    int64_t;\n"
"typedef unsigned __int8  uint8_t;\n"
"typedef unsigned __int16 uint16_t;\n"
"typedef unsigned __int32 uint32_t;\n"
"typedef unsigned __int64 uint64_t;\n"
"#include <stddef.h>\n"
"typedef size_t uintptr_t;\n"
"typedef ptrdiff intptr_t;\n"
"typedef ptrdiff ssize_t;\n"
"#else\n"
"#include <stdint.h>\n"
"#endif\n"
"\n"
"uint32_t PopulationCount64 (uint64_t a);\n"
"uint32_t PopulationCount32 (uint32_t a);\n"
"uint32_t CountTrailingZeros64 (uint64_t a);\n"
"uint32_t CountTrailingZeros32 (uint32_t a);\n"
"uint32_t CountLeadingZeros64 (uint64_t a);\n"
"uint32_t CountLeadingZeros32 (uint32_t a);\n"
"void Overflow(void);\n"
"#include <limits.h>\n"
);
}